

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O1

QString * __thiscall
QLocalSocketPrivate::generateErrorString
          (QString *__return_storage_ptr__,QLocalSocketPrivate *this,LocalSocketError error,
          QString *function)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  int iVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QArrayData *local_68 [3];
  QArrayData *local_50 [3];
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(error) {
  case ConnectionRefusedError:
    iVar5 = 0x282474;
    break;
  case PeerClosedError:
    iVar5 = 0x28248b;
    break;
  case ServerNotFoundError:
    iVar5 = 0x28249d;
    break;
  case SocketAccessError:
    iVar5 = 0x2824ae;
    break;
  case SocketResourceError:
    iVar5 = 0x2824c6;
    break;
  case SocketTimeoutError:
    iVar5 = 0x2824e0;
    break;
  case DatagramTooLargeError:
    iVar5 = 0x2824ff;
    break;
  case ConnectionError:
    iVar5 = 0x282516;
    break;
  default:
    QMetaObject::tr((char *)local_68,(char *)&QLocalSocket::staticMetaObject,0x28227c);
    QVar6.m_size = (size_t)local_68;
    QVar6.field_0.m_data = local_50;
    QString::arg_impl(QVar6,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
    piVar4 = __errno_location();
    QString::arg_impl((longlong)&local_38,(int)local_50,*piVar4,(QChar)0x0);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = (undefined4)local_38;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_30;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_30._4_4_;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_28;
    local_38 = pQVar1;
    uStack_30 = pcVar2;
    local_28 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (local_68[0] == (QArrayData *)0x0) goto LAB_0024756a;
    LOCK();
    (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar5 = (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    goto joined_r0x00247477;
  case UnsupportedSocketOperationError:
    iVar5 = 0x28252b;
    break;
  case OperationError:
    iVar5 = 0x282555;
  }
  QMetaObject::tr((char *)local_50,(char *)&QLocalSocket::staticMetaObject,iVar5);
  QVar7.m_size = (size_t)local_50;
  QVar7.field_0.m_data = &local_38;
  QString::arg_impl(QVar7,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  *(undefined4 *)&(__return_storage_ptr__->d).d = (undefined4)local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_30._4_4_;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_28;
  local_38 = pQVar1;
  uStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar5 = (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_68[0] = local_50[0];
joined_r0x00247477:
    if (iVar5 == 0) {
      QArrayData::deallocate(local_68[0],2,0x10);
    }
  }
LAB_0024756a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocalSocketPrivate::generateErrorString(QLocalSocket::LocalSocketError error, const QString &function) const
{
    QString errorString;
    switch (error) {
    case QLocalSocket::ConnectionRefusedError:
        errorString = QLocalSocket::tr("%1: Connection refused").arg(function);
        break;
    case QLocalSocket::PeerClosedError:
        errorString = QLocalSocket::tr("%1: Remote closed").arg(function);
        break;
    case QLocalSocket::ServerNotFoundError:
        errorString = QLocalSocket::tr("%1: Invalid name").arg(function);
        break;
    case QLocalSocket::SocketAccessError:
        errorString = QLocalSocket::tr("%1: Socket access error").arg(function);
        break;
    case QLocalSocket::SocketResourceError:
        errorString = QLocalSocket::tr("%1: Socket resource error").arg(function);
        break;
    case QLocalSocket::SocketTimeoutError:
        errorString = QLocalSocket::tr("%1: Socket operation timed out").arg(function);
        break;
    case QLocalSocket::DatagramTooLargeError:
        errorString = QLocalSocket::tr("%1: Datagram too large").arg(function);
        break;
    case QLocalSocket::ConnectionError:
        errorString = QLocalSocket::tr("%1: Connection error").arg(function);
        break;
    case QLocalSocket::UnsupportedSocketOperationError:
        errorString = QLocalSocket::tr("%1: The socket operation is not supported").arg(function);
        break;
    case QLocalSocket::OperationError:
        errorString = QLocalSocket::tr("%1: Operation not permitted when socket is in this state").arg(function);
        break;
    case QLocalSocket::UnknownSocketError:
    default:
        errorString = QLocalSocket::tr("%1: Unknown error %2").arg(function).arg(errno);
    }
    return errorString;
}